

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O3

void anon_unknown.dwarf_18eb07::doReadWriteManifest(IDManifest *mfst,string *fn,bool dump)

{
  _Base_ptr *pp_Var1;
  char *pcVar2;
  undefined8 uVar3;
  void *pvVar4;
  char cVar5;
  int iVar6;
  undefined4 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *this;
  Header *pHVar11;
  int *piVar12;
  ostream *poVar13;
  CompressedIDManifest *pCVar14;
  FrameBuffer buf;
  IDManifest read;
  size_t compressedDataSize;
  vector<char,_std::allocator<char>_> compressed;
  InputFile in;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined8 local_200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  undefined8 local_1e8;
  Header h;
  ostringstream str;
  ios_base local_138 [264];
  
  _str = 0;
  Imf_3_4::Header::Header(&h,0x40,0x40,1.0,(Vec2 *)&str,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::CompressedIDManifest::CompressedIDManifest((CompressedIDManifest *)&str,mfst);
  Imf_3_4::addIDManifest(&h,(CompressedIDManifest *)&str);
  Imf_3_4::CompressedIDManifest::~CompressedIDManifest((CompressedIDManifest *)&str);
  puVar7 = (undefined4 *)Imf_3_4::Header::dataWindow();
  *puVar7 = 0;
  lVar8 = Imf_3_4::Header::dataWindow();
  *(undefined4 *)(lVar8 + 4) = 0;
  lVar8 = Imf_3_4::Header::dataWindow();
  *(undefined4 *)(lVar8 + 8) = 0;
  lVar8 = Imf_3_4::Header::dataWindow();
  *(undefined4 *)(lVar8 + 0xc) = 0;
  puVar9 = (undefined8 *)Imf_3_4::Header::dataWindow();
  puVar10 = (undefined8 *)Imf_3_4::Header::displayWindow();
  *puVar10 = *puVar9;
  puVar10[1] = puVar9[1];
  local_1f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_208;
  local_208 = 0;
  local_200 = 0;
  local_1e8 = 0;
  local_1f0 = local_1f8;
  Imf_3_4::Channel::Channel((Channel *)&str,UINT,1,1,false);
  Imf_3_4::ChannelList::insert((char *)&in,(Channel *)0x1b7ae1);
  this = (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
          *)Imf_3_4::Header::channels();
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::operator=(this,(_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
                    *)&in);
  pcVar2 = (fn->_M_dataplus)._M_p;
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)&read,pcVar2,&h,iVar6);
  buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buf._map._M_t._M_impl.super__Rb_tree_header._M_header;
  buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 1;
  buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice((Slice *)&str,UINT,(char *)&compressed,1,0,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&buf,(Slice *)0x1b7ae1);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&read);
  Imf_3_4::OutputFile::writePixels((int)&read);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&buf);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)&read);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
               *)&in);
  pcVar2 = (fn->_M_dataplus)._M_p;
  iVar6 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(&in,pcVar2,iVar6);
  pHVar11 = (Header *)Imf_3_4::InputFile::header();
  piVar12 = (int *)Imf_3_4::idManifest(pHVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"compression: ",0xd);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," --> ",5);
  std::ostream::operator<<(poVar13,*piVar12);
  std::ostream::flush();
  pHVar11 = (Header *)Imf_3_4::InputFile::header();
  pCVar14 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar11);
  Imf_3_4::IDManifest::IDManifest(&read,pCVar14);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  operator<<((ostream *)&str,&read);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," raw decoded size: ",0x13);
  std::__cxx11::stringbuf::str();
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&compressed,1);
  pp_Var1 = &buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_) != pp_Var1) {
    operator_delete((undefined1 *)CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_),
                    (ulong)((long)&(buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                   ->_M_color + 1));
  }
  std::__cxx11::stringbuf::str();
  uVar3 = CONCAT44(buf._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                   buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
  if ((_Base_ptr *)CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_) != pp_Var1) {
    operator_delete((undefined1 *)CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_),
                    (ulong)((long)&(buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                   ->_M_color + 1));
  }
  compressedDataSize = exr_compress_max_buffer_size(uVar3);
  std::vector<char,_std::allocator<char>_>::vector
            (&compressed,compressedDataSize,(allocator_type *)&buf);
  std::__cxx11::stringbuf::str();
  exr_compress_buffer(0,4,CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_),uVar3,
                      CONCAT44(compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_),compressedDataSize,
                      &compressedDataSize);
  if ((_Base_ptr *)CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_) != pp_Var1) {
    operator_delete((undefined1 *)CONCAT71(buf._map._M_t._M_impl._1_7_,buf._map._M_t._M_impl._0_1_),
                    (ulong)((long)&(buf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                   ->_M_color + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"simple zip size: ",0x11)
  ;
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  buf._map._M_t._M_impl._0_1_ = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&buf,1);
  std::ostream::flush();
  if (dump) {
    operator<<((ostream *)&std::cout,&read);
  }
  cVar5 = Imf_3_4::IDManifest::operator!=(&read,mfst);
  if (cVar5 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"read manifest didn\'t match written manifest\n",0x2c);
  }
  remove((fn->_M_dataplus)._M_p);
  pvVar4 = (void *)CONCAT44(compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)compressed.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  std::ios_base::~ios_base(local_138);
  std::
  vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
  ::~vector(&read._manifest);
  if (local_1f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_204,local_208) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_204,local_208));
  }
  Imf_3_4::Header::~Header(&h);
  return;
}

Assistant:

void
doReadWriteManifest (const IDManifest& mfst, const string& fn, bool dump)
{
    Header h;
    addIDManifest (h, mfst);
    writeFile (h, fn);

    InputFile in (fn.c_str ());

    const CompressedIDManifest& cmpd = idManifest (in.header ());
    cerr << "compression: " << cmpd._uncompressedDataSize << " --> "
         << cmpd._compressedDataSize;
    cerr.flush ();

    IDManifest read = idManifest (in.header ());

    std::ostringstream str;
    str << read;

    cerr << " raw decoded size: " << str.str ().size () << ' ';

#define COMPARE_WITH_SIMPLE_ZIP
#ifdef COMPARE_WITH_SIMPLE_ZIP
    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t sourceDataSize     = str.str ().size ();
    size_t compressedDataSize = exr_compress_max_buffer_size (sourceDataSize);
    vector<char> compressed (compressedDataSize);

    exr_compress_buffer (
        nullptr,
        4,
        str.str ().c_str (),
        sourceDataSize,
        compressed.data (),
        compressedDataSize,
        &compressedDataSize);

    cerr << "simple zip size: " << compressedDataSize << ' ';
#endif

    cerr.flush ();
    if (dump) { cout << read; }
    if (read != mfst)
    {
        cerr << "read manifest didn't match written manifest\n";
        assert (read == mfst);
    }
    remove (fn.c_str ());
}